

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O3

string * short_name_abi_cxx11_(string *__return_storage_ptr__,Encoding *encoding)

{
  Encoding EVar1;
  char *pcVar2;
  char *pcVar3;
  
  EVar1 = *encoding;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(EVar1) {
  case MFM:
    pcVar3 = "mfm";
    pcVar2 = "";
    break;
  case FM:
    pcVar3 = "fm";
    pcVar2 = "";
    break;
  case RX02:
    pcVar3 = "rx";
    pcVar2 = "";
    break;
  case Amiga:
    pcVar3 = "ami";
    pcVar2 = "";
    break;
  case GCR:
    pcVar3 = "gcr";
    pcVar2 = "";
    break;
  case Ace:
    pcVar3 = "ace";
    pcVar2 = "";
    break;
  case MX:
    pcVar3 = "mx";
    pcVar2 = "";
    break;
  case Agat:
    pcVar3 = "agat";
    pcVar2 = "";
    break;
  case Apple:
    pcVar3 = "a2";
    pcVar2 = "";
    break;
  case Victor:
    pcVar3 = "vic";
    pcVar2 = "";
    break;
  case Vista:
    pcVar3 = "vis";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "unk";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string short_name(const Encoding& encoding)
{
    switch (encoding)
    {
    case Encoding::MFM:     return "mfm";           break;
    case Encoding::FM:      return "fm";            break;
    case Encoding::RX02:    return "rx";            break;
    case Encoding::Amiga:   return "ami";           break;
    case Encoding::GCR:     return "gcr";           break;
    case Encoding::Ace:     return "ace";           break;
    case Encoding::MX:      return "mx";            break;
    case Encoding::Agat:    return "agat";          break;
    case Encoding::Apple:   return "a2";            break;
    case Encoding::Victor:  return "vic";           break;
    case Encoding::Vista:   return "vis";           break;
    case Encoding::Unknown: break;
    }
    return "unk";
}